

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

void FinalizePSNR(VP8Encoder *enc)

{
  long lVar1;
  uint64_t err;
  long in_RDI;
  double dVar2;
  uint64_t *sse;
  uint64_t size;
  WebPAuxStats *stats;
  uint64_t in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x80);
  err = in_RDI + 0x5bd8;
  dVar2 = GetPSNR(err,in_stack_ffffffffffffffd8);
  *(float *)(lVar1 + 4) = (float)dVar2;
  dVar2 = GetPSNR(err,in_stack_ffffffffffffffd8);
  *(float *)(lVar1 + 8) = (float)dVar2;
  dVar2 = GetPSNR(err,in_stack_ffffffffffffffd8);
  *(float *)(lVar1 + 0xc) = (float)dVar2;
  dVar2 = GetPSNR(err,in_stack_ffffffffffffffd8);
  *(float *)(lVar1 + 0x10) = (float)dVar2;
  dVar2 = GetPSNR(err,in_stack_ffffffffffffffd8);
  *(float *)(lVar1 + 0x14) = (float)dVar2;
  return;
}

Assistant:

static void FinalizePSNR(const VP8Encoder* const enc) {
  WebPAuxStats* stats = enc->pic_->stats;
  const uint64_t size = enc->sse_count_;
  const uint64_t* const sse = enc->sse_;
  stats->PSNR[0] = (float)GetPSNR(sse[0], size);
  stats->PSNR[1] = (float)GetPSNR(sse[1], size / 4);
  stats->PSNR[2] = (float)GetPSNR(sse[2], size / 4);
  stats->PSNR[3] = (float)GetPSNR(sse[0] + sse[1] + sse[2], size * 3 / 2);
  stats->PSNR[4] = (float)GetPSNR(sse[3], size);
}